

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

bool __thiscall Image::is_approximately_equal_to(Image *this,Image *other)

{
  uint uVar1;
  Pixel PVar2;
  ostream *poVar3;
  int x;
  uint uVar4;
  int c;
  ulong uVar5;
  int c_1;
  int y;
  uint y_00;
  bool bVar6;
  double err [4];
  uchar local_7c [4];
  double local_78;
  double local_60;
  double local_58 [5];
  
  uVar1 = this->width;
  if ((uVar1 == other->width) && (uVar4 = this->height, uVar4 == other->height)) {
    local_58[2] = 0.0;
    local_58[3] = 0.0;
    local_58[0] = 0.0;
    local_58[1] = 0.0;
    for (y_00 = 0; y_00 < uVar4; y_00 = y_00 + 1) {
      for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
        for (uVar5 = 0; uVar5 < this->colors; uVar5 = uVar5 + 1) {
          PVar2 = operator()(this,uVar4,y_00);
          local_7c[0] = PVar2.colors[0];
          local_7c[1] = PVar2.colors[1];
          local_7c[2] = PVar2.colors[2];
          local_7c[3] = PVar2.colors[3];
          local_78 = (double)local_7c[uVar5];
          PVar2 = operator()(other,uVar4,y_00);
          local_7c[0] = PVar2.colors[0];
          local_7c[1] = PVar2.colors[1];
          local_7c[2] = PVar2.colors[2];
          local_7c[3] = PVar2.colors[3];
          local_58[uVar5] = ABS(local_78 - (double)local_7c[uVar5]) + local_58[uVar5];
        }
        uVar1 = this->width;
      }
      uVar4 = this->height;
    }
    local_60 = 1.0 / (double)(int)(uVar1 * uVar4);
    for (uVar5 = 0; bVar6 = this->colors <= uVar5, !bVar6; uVar5 = uVar5 + 1) {
      local_78 = local_58[uVar5] * local_60;
      if (this->error_threshold <= local_78 && local_78 != this->error_threshold) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Channel ");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)uVar5);
        std::operator<<(poVar3," error threshold (");
        poVar3 = std::ostream::_M_insert<double>(this->error_threshold);
        poVar3 = std::operator<<(poVar3,") exceeded.");
        std::operator<<(poVar3,"Average pixel error: ");
        poVar3 = std::ostream::_M_insert<double>(local_78);
        std::endl<char,std::char_traits<char>>(poVar3);
        return bVar6;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Channel ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)uVar5);
      std::operator<<(poVar3," average pixel error: ");
      poVar3 = std::ostream::_M_insert<double>(local_78);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Not approximately equal because dimensions are different.");
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Image::is_approximately_equal_to(const Image *other) const {
  if ((width != other->width) || (height != other->height)) {
    std::cerr << "Not approximately equal because dimensions are different." << std::endl;
    return false;
  }

  // Calculate the error on each channel
  double err[4] = {0.0};
  for (int y = 0; y < height; y++) {
    for (int x = 0; x < width; x++) {
      for (int c = 0; c < colors; c++) {
        auto this_val = (double) pixel(x, y).colors[c];
        auto that_val = (double) other->pixel(x, y).colors[c];

        err[c] += std::sqrt(std::pow(this_val - that_val, 2));
      }
    }
  }

  int total_pixels = width * height;

  for (int c = 0; c < colors; c++) {
    auto channel_err = err[c] / total_pixels;
    if (channel_err > error_threshold) {
      std::cerr << "Channel " << c << " error threshold (" << error_threshold << ") exceeded."
                << "Average pixel error: " << channel_err << std::endl;
      return false;
    } else {
      std::cout << "Channel " << c << " average pixel error: " << channel_err << std::endl;
    }
  }
  return true;
}